

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

int __thiscall
QCommonListViewBase::verticalScrollToValue
          (QCommonListViewBase *this,int param_1,ScrollHint hint,bool above,bool below,QRect *area,
          QRect *rect)

{
  int iVar1;
  QScrollBar *this_00;
  int iVar2;
  int iVar3;
  
  this_00 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this->qq);
  iVar1 = QAbstractSlider::value(&this_00->super_QAbstractSlider);
  iVar3 = this->dd->space;
  iVar2 = (rect->y1).m_i - iVar3;
  if (hint == PositionAtTop || above) {
    iVar1 = iVar1 + iVar2;
  }
  else {
    iVar3 = iVar3 + (rect->y2).m_i;
    if (hint == PositionAtBottom || below) {
      iVar3 = (iVar3 - (area->y2).m_i) + (area->y1).m_i;
      if (iVar2 < iVar3) {
        iVar3 = iVar2;
      }
      iVar1 = iVar1 + iVar3;
    }
    else if (hint == PositionAtCenter) {
      iVar1 = (iVar1 + iVar2) - (((area->y2).m_i + iVar2) - (iVar3 + (area->y1).m_i)) / 2;
    }
  }
  return iVar1;
}

Assistant:

int QCommonListViewBase::verticalScrollToValue(int /*index*/, QListView::ScrollHint hint,
                                          bool above, bool below, const QRect &area, const QRect &rect) const
{
    int verticalValue = verticalScrollBar()->value();
    QRect adjusted = rect.adjusted(-spacing(), -spacing(), spacing(), spacing());
    if (hint == QListView::PositionAtTop || above)
        verticalValue += adjusted.top();
    else if (hint == QListView::PositionAtBottom || below)
        verticalValue += qMin(adjusted.top(), adjusted.bottom() - area.height() + 1);
    else if (hint == QListView::PositionAtCenter)
        verticalValue += adjusted.top() - ((area.height() - adjusted.height()) / 2);
    return verticalValue;
}